

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_CreateDeviceOrModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *deviceOrModuleCreateInfo,
          IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  _Bool _Var1;
  int iVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo_00;
  BUFFER_HANDLE deviceJsonBuffer_00;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  BUFFER_HANDLE responseBuffer;
  BUFFER_HANDLE deviceJsonBuffer;
  LOGGER_LOG l_4;
  IOTHUB_DEVICE_OR_MODULE *tempDeviceOrModuleInfo;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo_local;
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *deviceOrModuleCreateInfo_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if (((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      (deviceOrModuleCreateInfo == (IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *)0x0)) ||
     (deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_CreateDeviceOrModule",0x56d,1,
                "Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    initializeDeviceOrModuleInfoMembers(deviceOrModuleInfo);
    if (deviceOrModuleCreateInfo->deviceId == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"IoTHubRegistryManager_CreateDeviceOrModule",0x576,1,"deviceId cannot be NULL");
      }
      l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else {
      iVar2 = strHasNoWhitespace(deviceOrModuleCreateInfo->deviceId);
      if (iVar2 == 0) {
        _Var1 = isAuthTypeAllowed(deviceOrModuleCreateInfo->authMethod);
        if (_Var1) {
          deviceOrModuleInfo_00 = (IOTHUB_DEVICE_OR_MODULE *)malloc(0xa0);
          if (deviceOrModuleInfo_00 == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"IoTHubRegistryManager_CreateDeviceOrModule",0x588,1,
                        "Malloc failed for tempDeviceOrModuleInfo");
            }
            l._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
          }
          else {
            memset(deviceOrModuleInfo_00,0,0xa0);
            deviceOrModuleInfo_00->deviceId = deviceOrModuleCreateInfo->deviceId;
            deviceOrModuleInfo_00->moduleId = deviceOrModuleCreateInfo->moduleId;
            deviceOrModuleInfo_00->primaryKey = deviceOrModuleCreateInfo->primaryKey;
            deviceOrModuleInfo_00->secondaryKey = deviceOrModuleCreateInfo->secondaryKey;
            deviceOrModuleInfo_00->authMethod = deviceOrModuleCreateInfo->authMethod;
            deviceOrModuleInfo_00->status = IOTHUB_DEVICE_STATUS_ENABLED;
            deviceOrModuleInfo_00->iotEdge_capable =
                 (_Bool)(deviceOrModuleCreateInfo->iotEdge_capable & 1);
            deviceOrModuleInfo_00->managedBy = deviceOrModuleCreateInfo->managedBy;
            l_5 = (LOGGER_LOG)0x0;
            deviceJsonBuffer_00 = constructDeviceOrModuleJson(deviceOrModuleInfo_00);
            if (deviceJsonBuffer_00 == (BUFFER_HANDLE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                          ,"IoTHubRegistryManager_CreateDeviceOrModule",0x59c,1,
                          "Json creation failed");
              }
              l._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
            }
            else {
              l_5 = (LOGGER_LOG)BUFFER_new();
              if ((BUFFER_HANDLE)l_5 == (BUFFER_HANDLE)0x0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"IoTHubRegistryManager_CreateDeviceOrModule",0x5a1,1,
                            "BUFFER_new failed for responseBuffer");
                }
                l._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
              }
              else {
                l._4_4_ = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_CREATE,
                                              deviceOrModuleCreateInfo->deviceId,
                                              deviceOrModuleCreateInfo->moduleId,deviceJsonBuffer_00
                                              ,0,(BUFFER_HANDLE)l_5);
                if (l._4_4_ == IOTHUB_REGISTRYMANAGER_ERROR) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                              ,"IoTHubRegistryManager_CreateDeviceOrModule",0x5a6,1,
                              "Failure sending HTTP request for create device");
                  }
                }
                else if (l._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
                  l._4_4_ = parseDeviceOrModuleJson((BUFFER_HANDLE)l_5,deviceOrModuleInfo);
                }
              }
            }
            if (l_5 != (LOGGER_LOG)0x0) {
              BUFFER_delete((BUFFER_HANDLE)l_5);
            }
            if (deviceJsonBuffer_00 != (BUFFER_HANDLE)0x0) {
              BUFFER_delete(deviceJsonBuffer_00);
            }
          }
          free(deviceOrModuleInfo_00);
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"IoTHubRegistryManager_CreateDeviceOrModule",0x580,1,
                      "Invalid authorization type specified");
          }
          l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"IoTHubRegistryManager_CreateDeviceOrModule",0x57b,1,
                    "deviceId cannot contain spaces");
        }
        l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      }
    }
  }
  return l._4_4_;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_CreateDeviceOrModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE* deviceOrModuleCreateInfo, IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleCreateInfo == NULL) || (deviceOrModuleInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        initializeDeviceOrModuleInfoMembers(deviceOrModuleInfo);

        if (deviceOrModuleCreateInfo->deviceId == NULL)
        {
            LogError("deviceId cannot be NULL");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if ((strHasNoWhitespace(deviceOrModuleCreateInfo->deviceId)) != 0)
        {
            LogError("deviceId cannot contain spaces");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if (isAuthTypeAllowed(deviceOrModuleCreateInfo->authMethod) == false)
        {
            LogError("Invalid authorization type specified");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else
        {
            IOTHUB_DEVICE_OR_MODULE* tempDeviceOrModuleInfo;
            if ((tempDeviceOrModuleInfo = malloc(sizeof(IOTHUB_DEVICE_OR_MODULE))) == NULL)
            {
                LogError("Malloc failed for tempDeviceOrModuleInfo");
                result = IOTHUB_REGISTRYMANAGER_ERROR;
            }
            else
            {
                memset(tempDeviceOrModuleInfo, 0, sizeof(*tempDeviceOrModuleInfo));
                tempDeviceOrModuleInfo->deviceId = deviceOrModuleCreateInfo->deviceId;
                tempDeviceOrModuleInfo->moduleId = deviceOrModuleCreateInfo->moduleId;
                tempDeviceOrModuleInfo->primaryKey = deviceOrModuleCreateInfo->primaryKey;
                tempDeviceOrModuleInfo->secondaryKey = deviceOrModuleCreateInfo->secondaryKey;
                tempDeviceOrModuleInfo->authMethod = deviceOrModuleCreateInfo->authMethod;
                tempDeviceOrModuleInfo->status = IOTHUB_DEVICE_STATUS_ENABLED;
                tempDeviceOrModuleInfo->iotEdge_capable = deviceOrModuleCreateInfo->iotEdge_capable;
                tempDeviceOrModuleInfo->managedBy = deviceOrModuleCreateInfo->managedBy;

                BUFFER_HANDLE deviceJsonBuffer = NULL;
                BUFFER_HANDLE responseBuffer = NULL;

                if ((deviceJsonBuffer = constructDeviceOrModuleJson(tempDeviceOrModuleInfo)) == NULL)
                {
                    LogError("Json creation failed");
                    result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
                else if ((responseBuffer = BUFFER_new()) == NULL)
                {
                    LogError("BUFFER_new failed for responseBuffer");
                    result = IOTHUB_REGISTRYMANAGER_ERROR;
                }
                else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_CREATE, deviceOrModuleCreateInfo->deviceId, deviceOrModuleCreateInfo->moduleId, deviceJsonBuffer, 0, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
                {
                    LogError("Failure sending HTTP request for create device");
                }
                else if (result == IOTHUB_REGISTRYMANAGER_OK)
                {
                    result = parseDeviceOrModuleJson(responseBuffer, deviceOrModuleInfo);
                }
                else
                {
                }

                if (responseBuffer != NULL)
                {
                    BUFFER_delete(responseBuffer);
                }
                if (deviceJsonBuffer != NULL)
                {
                    BUFFER_delete(deviceJsonBuffer);
                }
            }
            free(tempDeviceOrModuleInfo);
        }
    }
    return result;
}